

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O3

int BiCG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol)

{
  int iVar1;
  long lVar2;
  longdouble lVar3;
  longdouble in_ST1;
  longdouble in_ST3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar6;
  longdouble in_ST6;
  longdouble lVar7;
  longdouble in_ST7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  TPZFMatrix<long_double> rtilde;
  TPZFMatrix<long_double> ptilde;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> r;
  TPZFMatrix<long_double> ztilde;
  TPZFMatrix<long_double> rho_1;
  TPZFMatrix<long_double> qtilde;
  TPZFMatrix<long_double> q;
  TPZFMatrix<long_double> local_780;
  TPZFMatrix<long_double> local_6f0;
  TPZFMatrix<long_double> local_660;
  TPZFMatrix<long_double> local_5d0;
  TPZFMatrix<long_double> local_540;
  TPZFMatrix<long_double> local_4b0;
  TPZFMatrix<long_double> local_420;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_270.fElem = (longdouble *)0x0;
  local_270.fGiven = (longdouble *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_270.fWork.fStore = (longdouble *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  local_270.fElem = (longdouble *)operator_new__(0x10);
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_300.fElem = (longdouble *)0x0;
  local_300.fGiven = (longdouble *)0x0;
  local_300.fSize = 0;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_300.fWork.fStore = (longdouble *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.fElem = (longdouble *)operator_new__(0x10);
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_540.fElem = (longdouble *)0x0;
  local_540.fGiven = (longdouble *)0x0;
  local_540.fSize = 0;
  TPZVec<int>::TPZVec(&local_540.fPivot.super_TPZVec<int>,0);
  local_540.fPivot.super_TPZVec<int>.fStore = local_540.fPivot.fExtAlloc;
  local_540.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_540.fPivot.super_TPZVec<int>.fNElements = 0;
  local_540.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_540.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_540.fWork.fStore = (longdouble *)0x0;
  local_540.fWork.fNElements = 0;
  local_540.fWork.fNAlloc = 0;
  local_540.fElem = (longdouble *)operator_new__(0x10);
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_390.fElem = (longdouble *)0x0;
  local_390.fGiven = (longdouble *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_390.fWork.fStore = (longdouble *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_390.fElem = (longdouble *)operator_new__(0x10);
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_5d0.fElem = (longdouble *)0x0;
  local_5d0.fGiven = (longdouble *)0x0;
  local_5d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_5d0.fPivot.super_TPZVec<int>,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_5d0.fWork.fStore = (longdouble *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_420.fElem = (longdouble *)0x0;
  local_420.fGiven = (longdouble *)0x0;
  local_420.fSize = 0;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_420.fWork.fStore = (longdouble *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_660.fElem = (longdouble *)0x0;
  local_660.fGiven = (longdouble *)0x0;
  local_660.fSize = 0;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_660.fWork.fStore = (longdouble *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_6f0.fElem = (longdouble *)0x0;
  local_6f0.fGiven = (longdouble *)0x0;
  local_6f0.fSize = 0;
  TPZVec<int>::TPZVec(&local_6f0.fPivot.super_TPZVec<int>,0);
  local_6f0.fPivot.super_TPZVec<int>.fStore = local_6f0.fPivot.fExtAlloc;
  local_6f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_6f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_6f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_6f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_6f0.fWork.fStore = (longdouble *)0x0;
  local_6f0.fWork.fNElements = 0;
  local_6f0.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_c0.fElem = (longdouble *)0x0;
  local_c0.fGiven = (longdouble *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_c0.fWork.fStore = (longdouble *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_1e0.fElem = (longdouble *)0x0;
  local_1e0.fGiven = (longdouble *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_1e0.fWork.fStore = (longdouble *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  Dot<long_double>(b,b);
  lVar4 = in_ST7;
  sqrtl();
  lVar5 = lVar4;
  TPZMatrix<long_double>::operator*(&local_780,A,x);
  TPZFMatrix<long_double>::operator-(&local_4b0,b,&local_780);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_780);
  TPZFMatrix<long_double>::TPZFMatrix(&local_780,&local_4b0);
  Dot<long_double>(&local_4b0,&local_4b0);
  uVar8 = -(ulong)((double)in_ST1 == 0.0);
  dVar10 = (double)(~uVar8 & (ulong)(double)in_ST1 | uVar8 & 0x3ff0000000000000);
  lVar6 = lVar5;
  sqrtl();
  dVar9 = (double)(-(ulong)((double)in_ST3 / dVar10 <= *tol) & 0x3ff0000000000000);
  if (*tol < (double)in_ST3 / dVar10) {
    if (0 < *max_iter) {
      lVar2 = 0;
      do {
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_4b0,&local_5d0,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_780,&local_420,0);
        Dot<long_double>(&local_5d0,&local_780);
        *local_270.fElem = in_ST4;
        if (((double)in_ST4 == 0.0) && (!NAN((double)in_ST4))) {
          Dot<long_double>(&local_4b0,&local_4b0);
          sqrtl();
          *tol = (double)in_ST6 / dVar10;
          *max_iter = lVar2 + 1;
          iVar1 = 2;
          goto LAB_00c4a520;
        }
        if (lVar2 == 0) {
          lVar7 = lVar6;
          TPZFMatrix<long_double>::operator=(&local_660,&local_5d0);
          TPZFMatrix<long_double>::operator=(&local_6f0,&local_420);
          lVar3 = in_ST7;
          in_ST4 = lVar4;
          in_ST6 = lVar6;
          in_ST7 = lVar7;
        }
        else {
          lVar3 = *local_300.fElem;
          *local_390.fElem = in_ST4 / lVar3;
          lVar7 = lVar6;
          TPZFMatrix<long_double>::TimesBetaPlusZ(&local_660,in_ST4 / lVar3,&local_5d0);
          TPZFMatrix<long_double>::TimesBetaPlusZ(&local_6f0,*local_390.fElem,&local_420);
          lVar3 = in_ST7;
          in_ST4 = lVar4;
          in_ST6 = lVar6;
          in_ST7 = lVar7;
        }
        TPZMatrix<long_double>::operator*(&local_150,A,&local_660);
        TPZFMatrix<long_double>::operator=(&local_c0,&local_150);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_6f0,&local_1e0)
        ;
        lVar6 = *local_270.fElem;
        Dot<long_double>(&local_6f0,&local_c0);
        *local_540.fElem = lVar6 / in_ST5;
        lVar4 = in_ST7;
        TPZFMatrix<long_double>::operator*(&local_150,&local_660,lVar6 / in_ST5);
        TPZFMatrix<long_double>::operator+=(x,&local_150.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
        TPZFMatrix<long_double>::operator*(&local_150,&local_c0,*local_540.fElem);
        TPZFMatrix<long_double>::operator-=(&local_4b0,&local_150.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
        TPZFMatrix<long_double>::operator*(&local_150,&local_1e0,*local_540.fElem);
        TPZFMatrix<long_double>::operator-=(&local_780,&local_150.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
        *local_300.fElem = *local_270.fElem;
        in_ST5 = lVar5;
        lVar5 = lVar4;
        Dot<long_double>(&local_4b0,&local_4b0);
        lVar6 = lVar5;
        sqrtl();
        dVar9 = (double)lVar3 / dVar10;
        if (dVar9 < *tol) {
          *tol = dVar9;
          *max_iter = lVar2 + 1;
          goto LAB_00c4a24b;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < *max_iter);
    }
    *tol = dVar9;
    iVar1 = 1;
  }
  else {
    *tol = dVar9;
    *max_iter = 0;
LAB_00c4a24b:
    iVar1 = 0;
  }
LAB_00c4a520:
  TPZFMatrix<long_double>::~TPZFMatrix(&local_780);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_4b0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_660);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_420);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_5d0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
  return iVar1;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}